

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntaxAnalysis.cpp
# Opt level: O1

int constDefineInt(function *fn)

{
  int l;
  pointer pcVar1;
  ulong uVar2;
  long lVar3;
  string id;
  Identifier con;
  long *local_f0;
  long local_e8;
  long local_e0 [2];
  string local_d0;
  Identifier local_b0;
  string local_40;
  
  getToken();
  uVar2 = ((long)formerAns_abi_cxx11_.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)formerAns_abi_cxx11_.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
  lVar3 = ~(long)tokenPointer + uVar2;
  if (CARRY8(~(long)tokenPointer,uVar2)) {
    l = formerAns_abi_cxx11_.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar3].second;
    pcVar1 = formerAns_abi_cxx11_.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar3].first._M_dataplus._M_p;
    local_f0 = local_e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,pcVar1,
               pcVar1 + formerAns_abi_cxx11_.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar3].first._M_string_length);
    getToken();
    getToken();
    integer(0,1);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,local_f0,local_e8 + (long)local_f0);
    Identifier::Identifier(&local_b0,&local_d0,INTTK);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    Identifier::setValue(&local_b0,num);
    Identifier::setDimension(&local_b0,1,1);
    Identifier::setDimension(&local_b0,2,1);
    Identifier::setIdentifierCategory(&local_b0,CONST);
    tokenType::getName_abi_cxx11_(&local_40,&fn->super_tokenType);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if (local_40._M_string_length == 0) {
      identityTable::addToken(&globalTable,&local_b0,l);
    }
    else {
      function::addToken(fn,&local_b0,l);
    }
    getToken();
    if (local_b0.intValue.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.intValue.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b0.intValue.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.intValue.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_b0.charValue.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.charValue.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b0.charValue.super__Vector_base<char,_std::allocator<char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.charValue.super__Vector_base<char,_std::allocator<char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.super_tokenType.name._M_dataplus._M_p != &local_b0.super_tokenType.name.field_2)
    {
      operator_delete(local_b0.super_tokenType.name._M_dataplus._M_p,
                      local_b0.super_tokenType.name.field_2._M_allocated_capacity + 1);
    }
    if (local_f0 != local_e0) {
      operator_delete(local_f0,local_e0[0] + 1);
    }
    return 1;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

int constDefineInt(function &fn) {
    getToken();//IDENFR
    int l = formerAns.at(formerAns.size() - 1 - tokenPointer).second;
    string id = formerAns.at(formerAns.size() - 1 - tokenPointer).first;
    getToken();//ASSIGN
    getToken();
    integer(0, 1);
    Identifier con(id, INTTK);
    con.setValue(num);
    con.setDimension(1, 1);
    con.setDimension(2, 1);
    con.setIdentifierCategory(CONST);
    if (fn.getName().empty())
        globalTable.addToken(con, l);
    else
        fn.addToken(con, l);
    getToken();
    return 1;
}